

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_analysis.cc
# Opt level: O1

void __thiscall pass_check_function_return_Test::TestBody(pass_check_function_return_Test *this)

{
  size_type *psVar1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  Generator *top;
  undefined1 local_1d0 [8];
  Context c;
  shared_ptr<kratos::Port> b;
  shared_ptr<kratos::Port> a;
  shared_ptr<kratos::FunctionStmtBlock> func;
  undefined1 local_78 [32];
  AssertHelper local_58;
  _Alloc_hider local_50;
  undefined1 auStack_48 [8];
  TrueWithString gtest_msg;
  
  local_1d0 = (undefined1  [8])&c.modules_._M_h._M_rehash_policy._M_next_resize;
  c.modules_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.modules_._M_h._M_bucket_count = 0;
  c.modules_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.modules_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.modules_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.modules_._M_h._M_rehash_policy._4_4_ = 0;
  c.modules_._M_h._M_rehash_policy._M_next_resize = 0;
  c.modules_._M_h._M_single_bucket =
       (__node_base_ptr)&c.generator_hash_._M_h._M_rehash_policy._M_next_resize;
  c.generator_hash_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.generator_hash_._M_h._M_bucket_count = 0;
  c.generator_hash_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.generator_hash_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&c.enum_defs_;
  c.enum_defs_._M_t._M_impl._0_4_ = 0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.generator_hash_._M_h._M_rehash_policy._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_next_resize = 0;
  c.generator_hash_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&c.empty_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.empty_generators_._M_h._M_bucket_count = 0;
  c.empty_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.empty_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c._224_8_ = &c.tracked_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.empty_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.empty_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  c.empty_generators_._M_h._M_single_bucket._0_1_ = 0;
  c.tracked_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.tracked_generators_._M_h._M_bucket_count = 0;
  c.tracked_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.tracked_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.tracked_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.tracked_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.tracked_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  psVar1 = &gtest_msg.value._M_string_length;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  auStack_48 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_48,"mod","");
  top = kratos::Context::generator((Context *)local_1d0,(string *)auStack_48);
  if (auStack_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_48,gtest_msg.value._M_string_length + 1);
  }
  auStack_48 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_48,"test_func","");
  kratos::Generator::function
            ((Generator *)
             &a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)top);
  if (auStack_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_48,gtest_msg.value._M_string_length + 1);
  }
  _Var3._M_pi = a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  auStack_48 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_48,"a","");
  (*(_Var3._M_pi)->_vptr__Sp_counted_base[0xd])
            (&b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,_Var3._M_pi
             ,auStack_48,1,0);
  if (auStack_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_48,gtest_msg.value._M_string_length + 1);
  }
  _Var3._M_pi = a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  auStack_48 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_48,"b","");
  (*(_Var3._M_pi)->_vptr__Sp_counted_base[0xd])
            (&c.tracked_generators_._M_h._M_single_bucket,_Var3._M_pi,auStack_48,1,0);
  if (auStack_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_48,gtest_msg.value._M_string_length + 1);
  }
  _Var3._M_pi = a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_58.data_ =
       (AssertHelperData *)
       b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_50._M_p = (pointer)a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar2 = &((a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Var)
                .super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar2 = &((a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Var)
                .super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  kratos::FunctionStmtBlock::return_stmt
            ((FunctionStmtBlock *)local_78,
             (shared_ptr<kratos::Var> *)
             a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  auStack_48 = (undefined1  [8])local_78._0_8_;
  gtest_msg.value._M_dataplus._M_p = (pointer)local_78._8_8_;
  local_78._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_78._8_8_ = (pointer)0x0;
  kratos::StmtBlock::add_stmt((StmtBlock *)_Var3._M_pi,(shared_ptr<kratos::Stmt> *)auStack_48);
  if (gtest_msg.value._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)gtest_msg.value._M_dataplus._M_p);
  }
  if ((pointer)local_78._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  if ((element_type *)local_50._M_p != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_p);
  }
  _Var3._M_pi = a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_58.data_ = (AssertHelperData *)c.tracked_generators_._M_h._M_single_bucket;
  local_50._M_p = (pointer)b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar2 = &((b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Var)
                .super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar2 = &((b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Var)
                .super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  kratos::FunctionStmtBlock::return_stmt
            ((FunctionStmtBlock *)local_78,
             (shared_ptr<kratos::Var> *)
             a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  auStack_48 = (undefined1  [8])local_78._0_8_;
  gtest_msg.value._M_dataplus._M_p = (pointer)local_78._8_8_;
  local_78._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_78._8_8_ = (pointer)0x0;
  kratos::StmtBlock::add_stmt((StmtBlock *)_Var3._M_pi,(shared_ptr<kratos::Stmt> *)auStack_48);
  if (gtest_msg.value._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)gtest_msg.value._M_dataplus._M_p);
  }
  if ((pointer)local_78._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  if ((element_type *)local_50._M_p != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_p);
  }
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  gtest_msg.value._M_dataplus._M_p = (pointer)0x0;
  gtest_msg.value._M_string_length = 0;
  auStack_48 = (undefined1  [8])psVar1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    kratos::check_function_return(top);
  }
  std::__cxx11::string::_M_replace((ulong)auStack_48,0,gtest_msg.value._M_dataplus._M_p,0x23e585);
  testing::Message::Message((Message *)local_78);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)(local_78 + 0x20),kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_analysis.cc"
             ,0x3c,(char *)auStack_48);
  testing::internal::AssertHelper::operator=((AssertHelper *)(local_78 + 0x20),(Message *)local_78);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_78 + 0x20));
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(_func_int **)local_78._0_8_ + 8))();
  }
  if (auStack_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_48,gtest_msg.value._M_string_length + 1);
  }
  (*(a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base[0xc])();
  _Var3 = a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_58.data_ =
       (AssertHelperData *)
       b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_50._M_p = (pointer)a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar2 = &((a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Var)
                .super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar2 = &((a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Var)
                .super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  kratos::FunctionStmtBlock::return_stmt
            ((FunctionStmtBlock *)local_78,
             (shared_ptr<kratos::Var> *)
             a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  auStack_48 = (undefined1  [8])local_78._0_8_;
  gtest_msg.value._M_dataplus._M_p = (pointer)local_78._8_8_;
  local_78._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_78._8_8_ = (pointer)0x0;
  kratos::StmtBlock::add_stmt((StmtBlock *)_Var3._M_pi,(shared_ptr<kratos::Stmt> *)auStack_48);
  if (gtest_msg.value._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)gtest_msg.value._M_dataplus._M_p);
  }
  if ((pointer)local_78._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  if ((element_type *)local_50._M_p != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_p);
  }
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  gtest_msg.value._M_dataplus._M_p = (pointer)0x0;
  gtest_msg.value._M_string_length = 0;
  auStack_48 = (undefined1  [8])psVar1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    kratos::check_function_return(top);
  }
  if (auStack_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_48,gtest_msg.value._M_string_length + 1);
  }
  (*(a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base[0xc])();
  _Var3 = a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  kratos::Const::constant(1,1,false);
  kratos::Var::assign((Var *)local_78,
                      (Var *)b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
  auStack_48 = (undefined1  [8])local_78._0_8_;
  gtest_msg.value._M_dataplus._M_p = (pointer)local_78._8_8_;
  local_78._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_78._8_8_ = (pointer)0x0;
  kratos::StmtBlock::add_stmt((StmtBlock *)_Var3._M_pi,(shared_ptr<kratos::Stmt> *)auStack_48);
  if (gtest_msg.value._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)gtest_msg.value._M_dataplus._M_p);
  }
  if ((pointer)local_78._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  local_58.data_ = (AssertHelperData *)c.tracked_generators_._M_h._M_single_bucket;
  local_50._M_p = (pointer)b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar2 = &((b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Var)
                .super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar2 = &((b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Var)
                .super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  kratos::FunctionStmtBlock::return_stmt
            ((FunctionStmtBlock *)local_78,
             (shared_ptr<kratos::Var> *)
             a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  auStack_48 = (undefined1  [8])local_78._0_8_;
  gtest_msg.value._M_dataplus._M_p = (pointer)local_78._8_8_;
  local_78._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_78._8_8_ = (pointer)0x0;
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)
             a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             (shared_ptr<kratos::Stmt> *)auStack_48);
  if (gtest_msg.value._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)gtest_msg.value._M_dataplus._M_p);
  }
  if ((pointer)local_78._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  if ((element_type *)local_50._M_p != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_p);
  }
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  gtest_msg.value._M_dataplus._M_p = (pointer)0x0;
  gtest_msg.value._M_string_length = 0;
  auStack_48 = (undefined1  [8])psVar1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    kratos::check_function_return(top);
  }
  if (auStack_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_48,gtest_msg.value._M_string_length + 1);
  }
  if (b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (func.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               func.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
  }
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.track_generated_);
  std::
  _Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
               *)&c.max_instance_id_);
  std::
  _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&c.modules_._M_h._M_single_bucket);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_1d0);
  return;
}

Assistant:

TEST(pass, check_function_return) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto func = mod.function("test_func");
    auto a = func->input("a", 1, false);
    auto b = func->input("b", 1, false);
    func->add_stmt(func->return_stmt(a));
    func->add_stmt(func->return_stmt(b));

    EXPECT_THROW(check_function_return(&mod), StmtException);
    // clear the statements
    func->clear();
    func->add_stmt(func->return_stmt(a));
    EXPECT_NO_THROW(check_function_return(&mod));
    // clear the statements
    func->clear();
    func->add_stmt(a->assign(constant(1, 1)));
    func->add_stmt(func->return_stmt(b));
    EXPECT_NO_THROW(check_function_return(&mod));
}